

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O2

void __thiscall
Node::AddList(Node *this,string *name,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *attribute_list)

{
  pointer pbVar1;
  pointer pbVar2;
  shared_ptr<Node> list_node;
  string list_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> item;
  undefined1 local_d0 [32];
  string local_b0 [32];
  string local_90;
  string local_70;
  allocator local_50 [32];
  
  local_b0[0] = (string)0x1;
  std::make_shared<Node,std::__cxx11::string&,bool>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
             (bool *)name);
  std::__cxx11::string::string(local_b0,"",local_50);
  pbVar1 = (attribute_list->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (attribute_list->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    std::__cxx11::string::string((string *)local_50,(string *)pbVar2);
    std::__cxx11::string::append(local_b0);
    std::__cxx11::string::append((char *)local_b0);
    std::__cxx11::string::~string((string *)local_50);
  }
  std::__cxx11::string::string((string *)&local_70,"List",local_50);
  std::__cxx11::string::string((string *)&local_90,local_b0);
  AddAttribute((Node *)local_d0._0_8_,&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 0x10),
             (__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)local_d0);
  AddChild(this,(shared_ptr<Node> *)(local_d0 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 0x18));
  std::__cxx11::string::~string(local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
  return;
}

Assistant:

void Node::AddList(std::string name, std::vector<std::string> attribute_list) {
    std::shared_ptr<Node> list_node = std::make_shared<Node>(name, true);
    std::string list_string = "";
    for(auto item: attribute_list) {
        list_string.append(item);
        list_string.append(";");
    }
    list_node->AddAttribute("List", list_string);
    this->AddChild(list_node);
}